

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O1

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  
  iVar9 = bottom_blob->dims;
  if (iVar9 == 3) {
    iVar9 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    uVar1 = bottom_blob->c;
    Mat::create(top_blob,iVar9,iVar2,uVar1,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar14) {
      return -100;
    }
    if (0 < (int)uVar1) {
      uVar12 = iVar2 * iVar9;
      uVar13 = 0;
      do {
        uVar11 = 0;
        if (this->scale_data_size != 1) {
          uVar11 = uVar13 & 0xffffffff;
        }
        if (0 < (int)uVar12) {
          sVar5 = bottom_blob->elemsize;
          sVar6 = top_blob->elemsize;
          fVar16 = *(float *)((long)(this->scale_data).data + uVar11 * 4);
          sVar7 = top_blob->cstep;
          pvVar3 = top_blob->data;
          sVar8 = bottom_blob->cstep;
          pvVar4 = bottom_blob->data;
          uVar11 = 0;
          do {
            fVar15 = roundf(*(float *)((long)pvVar4 + uVar11 * 4 + sVar5 * sVar8 * uVar13) * fVar16)
            ;
            iVar9 = (int)fVar15;
            if (iVar9 < -0x7e) {
              iVar9 = -0x7f;
            }
            if (0x7e < iVar9) {
              iVar9 = 0x7f;
            }
            *(char *)((long)pvVar3 + uVar11 + sVar6 * sVar7 * uVar13) = (char)iVar9;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar1);
    }
    if (bVar14) {
      return -100;
    }
  }
  else if (iVar9 == 2) {
    uVar1 = bottom_blob->w;
    uVar12 = bottom_blob->h;
    Mat::create(top_blob,uVar1,uVar12,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar14) {
      return -100;
    }
    if (0 < (int)uVar12) {
      uVar13 = 0;
      do {
        uVar11 = 0;
        if (this->scale_data_size != 1) {
          uVar11 = uVar13 & 0xffffffff;
        }
        if (0 < (int)uVar1) {
          iVar9 = bottom_blob->w;
          iVar2 = top_blob->w;
          fVar16 = *(float *)((long)(this->scale_data).data + uVar11 * 4);
          sVar5 = top_blob->elemsize;
          pvVar3 = top_blob->data;
          sVar6 = bottom_blob->elemsize;
          pvVar4 = bottom_blob->data;
          uVar11 = 0;
          do {
            fVar15 = roundf(*(float *)((long)pvVar4 + uVar11 * 4 + sVar6 * uVar13 * (long)iVar9) *
                            fVar16);
            iVar10 = (int)fVar15;
            if (iVar10 < -0x7e) {
              iVar10 = -0x7f;
            }
            if (0x7e < iVar10) {
              iVar10 = 0x7f;
            }
            *(char *)((long)pvVar3 + uVar11 + sVar5 * uVar13 * (long)iVar2) = (char)iVar10;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
    }
    if (bVar14) {
      return -100;
    }
  }
  else if (iVar9 == 1) {
    uVar1 = bottom_blob->w;
    Mat::create(top_blob,uVar1,1,opt->blob_allocator);
    pvVar3 = top_blob->data;
    if (pvVar3 == (void *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar14) {
      return -100;
    }
    pvVar4 = bottom_blob->data;
    if (this->scale_data_size == 1) {
      if (0 < (int)uVar1) {
        fVar16 = *(this->scale_data).data;
        uVar13 = 0;
        do {
          fVar15 = roundf(*(float *)((long)pvVar4 + uVar13 * 4) * fVar16);
          iVar9 = (int)fVar15;
          if (iVar9 < -0x7e) {
            iVar9 = -0x7f;
          }
          if (0x7e < iVar9) {
            iVar9 = 0x7f;
          }
          *(char *)((long)pvVar3 + uVar13) = (char)iVar9;
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
    }
    else if (0 < (int)uVar1) {
      uVar13 = 0;
      do {
        fVar16 = roundf(*(float *)((long)(this->scale_data).data + uVar13 * 4) *
                        *(float *)((long)pvVar4 + uVar13 * 4));
        iVar9 = (int)fVar16;
        if (iVar9 < -0x7e) {
          iVar9 = -0x7f;
        }
        if (0x7e < iVar9) {
          iVar9 = 0x7f;
        }
        *(char *)((long)pvVar3 + uVar13) = (char)iVar9;
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
    }
    if (bVar14) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale_data[i]);
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const float* ptr0 = bottom_blob.row(i);
            signed char* outptr0 = top_blob.row<signed char>(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

            for (int j = 0; j < w; j++)
            {
                outptr0[j] = float2int8(ptr0[j] * scale);
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}